

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

bool vkt::sr::anon_unknown_0::isValidCase(TextureType type,IVec3 *textureSize,int lod,int lodBase)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  
  iVar1 = textureSize->m_data[0];
  iVar2 = textureSize->m_data[1];
  bVar6 = false;
  if (iVar1 == iVar2) {
    uVar4 = textureSize->m_data[2] * -0x55555555 + 0x2aaaaaaa;
    bVar6 = (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f) < 0x2aaaaaab;
  }
  iVar5 = 0;
  if (type < TEXTURETYPE_LAST) {
    if ((0x6aU >> (type & 0x1f) & 1) == 0) {
      iVar5 = iVar1;
      if ((0x11U >> (type & 0x1f) & 1) != 0) goto LAB_006125ae;
      iVar5 = textureSize->m_data[2];
      if (textureSize->m_data[2] < iVar2) {
        iVar5 = iVar2;
      }
      iVar3 = iVar1 - iVar5;
      bVar7 = iVar3 == 0;
    }
    else {
      iVar3 = iVar1 - iVar2;
      bVar7 = iVar1 == iVar2;
      iVar5 = iVar2;
    }
    if (!bVar7 && SBORROW4(iVar1,iVar5) == iVar3 < 0) {
      iVar5 = iVar1;
    }
  }
LAB_006125ae:
  bVar7 = false;
  if ((type != TEXTURETYPE_CUBE_MAP || iVar1 == iVar2) &&
     (iVar5 >> ((char)lodBase + (char)lod & 0x1fU) != 0)) {
    bVar7 = (bool)(type != TEXTURETYPE_CUBE_ARRAY | bVar6);
  }
  return bVar7;
}

Assistant:

T						x			(void) const { return m_data[0]; }